

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Symbol left_section_op(Env *env,uint32_t start)

{
  _Bool _Var1;
  Space SVar2;
  Symbol SVar3;
  Space space;
  uint32_t start_local;
  Env *env_local;
  
  _Var1 = valid(env,LEFT_SECTION_OP);
  if (_Var1) {
    advance_before(env,start);
    SVar2 = skip_whitespace(env);
    _Var1 = char_at(env,start,0x29);
    if (_Var1) {
      SVar3 = finish(LEFT_SECTION_OP,"left section");
      return SVar3;
    }
    if (SVar2 != NoSpace) {
      SVar3 = finish_if_valid(env,NO_SECTION_OP,"left section");
      return SVar3;
    }
  }
  return FAIL;
}

Assistant:

static Symbol left_section_op(Env *env, uint32_t start) {
  if (valid(env, LEFT_SECTION_OP)) {
    advance_before(env, start);
    Space space = skip_whitespace(env);
    if (char_at(env, start, ')')) return finish(LEFT_SECTION_OP, "left section");
    if (space != NoSpace) return finish_if_valid(env, NO_SECTION_OP, "left section");
  }
  return FAIL;
}